

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocsp.cc
# Opt level: O2

bool __thiscall bssl::ParseOCSPResponseData(bssl *this,Input raw_tlv,OCSPResponseData *out)

{
  Input input;
  Input input_00;
  Input input_01;
  bool bVar1;
  uint8_t *out_00;
  Input input_02;
  bool version_present;
  CBS_ASN1_TAG id_tag;
  Parser parser;
  Input id_input;
  Parser responses_parser;
  Input responder_input;
  Input version_input;
  Input local_68;
  Parser key_parser;
  Parser outer_parser;
  
  out_00 = (uint8_t *)raw_tlv.data_.size_;
  input_02.data_.size_ = (size_t)raw_tlv.data_.data_;
  input_02.data_.data_ = (uchar *)this;
  der::Parser::Parser(&outer_parser,input_02);
  der::Parser::Parser(&parser);
  bVar1 = der::Parser::ReadSequence(&outer_parser,&parser);
  if ((bVar1) && (bVar1 = der::Parser::HasMore(&outer_parser), !bVar1)) {
    version_input.data_.data_ = (uchar *)0x0;
    version_input.data_.size_ = 0;
    bVar1 = der::Parser::ReadOptionalTag(&parser,0xa0000000,&version_input,&version_present);
    if (bVar1) {
      if (version_present == true) {
        input_01.data_.size_ = version_input.data_.size_;
        input_01.data_.data_ = version_input.data_.data_;
        der::Parser::Parser(&responses_parser,input_01);
        bVar1 = der::Parser::ReadUint8(&responses_parser,out_00);
        if (!bVar1) {
          return false;
        }
        bVar1 = der::Parser::HasMore(&responses_parser);
        if (bVar1) {
          return false;
        }
        if (*out_00 != '\0') {
          return false;
        }
      }
      else {
        *out_00 = '\0';
      }
      responder_input.data_.data_ = (uchar *)0x0;
      responder_input.data_.size_ = 0;
      bVar1 = der::Parser::ReadRawTLV(&parser,&responder_input);
      if (bVar1) {
        input_00.data_.size_ = responder_input.data_.size_;
        input_00.data_.data_ = responder_input.data_.data_;
        der::Parser::Parser(&responses_parser,input_00);
        id_input.data_.data_ = (uchar *)0x0;
        id_input.data_.size_ = 0;
        bVar1 = der::Parser::ReadTagAndValue(&responses_parser,&id_tag,&id_input);
        if (bVar1) {
          if (id_tag == 0xa0000002) {
            input.data_.size_ = id_input.data_.size_;
            input.data_.data_ = id_input.data_.data_;
            der::Parser::Parser(&key_parser,input);
            local_68.data_.data_ = (uchar *)0x0;
            local_68.data_.size_ = 0;
            bVar1 = der::Parser::ReadTag(&key_parser,4,&local_68);
            if (!bVar1) {
              return false;
            }
            bVar1 = der::Parser::HasMore(&key_parser);
            if (bVar1) {
              return false;
            }
            if (local_68.data_.size_ != 0x14) {
              return false;
            }
            out_00[8] = '\x01';
            out_00[9] = '\0';
            out_00[10] = '\0';
            out_00[0xb] = '\0';
            *(uchar **)(out_00 + 0x20) = local_68.data_.data_;
            out_00[0x28] = '\x14';
            out_00[0x29] = '\0';
            out_00[0x2a] = '\0';
            out_00[0x2b] = '\0';
            out_00[0x2c] = '\0';
            out_00[0x2d] = '\0';
            out_00[0x2e] = '\0';
            out_00[0x2f] = '\0';
          }
          else {
            if (id_tag != 0xa0000001) {
              return false;
            }
            out_00[8] = '\0';
            out_00[9] = '\0';
            out_00[10] = '\0';
            out_00[0xb] = '\0';
            *(uchar **)(out_00 + 0x10) = id_input.data_.data_;
            *(size_t *)(out_00 + 0x18) = id_input.data_.size_;
          }
          bVar1 = der::Parser::HasMore(&responses_parser);
          if ((!bVar1) &&
             (bVar1 = der::Parser::ReadGeneralizedTime(&parser,(GeneralizedTime *)(out_00 + 0x30)),
             bVar1)) {
            der::Parser::Parser(&responses_parser);
            bVar1 = der::Parser::ReadSequence(&parser,&responses_parser);
            if (bVar1) {
              if (*(long *)(out_00 + 0x40) != *(long *)(out_00 + 0x38)) {
                *(long *)(out_00 + 0x40) = *(long *)(out_00 + 0x38);
              }
              while (bVar1 = der::Parser::HasMore(&responses_parser), bVar1) {
                key_parser.cbs_.data = (uint8_t *)0x0;
                key_parser.cbs_.len = 0;
                bVar1 = der::Parser::ReadRawTLV(&responses_parser,(Input *)&key_parser);
                if (!bVar1) {
                  return false;
                }
                ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::push_back
                          ((vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)
                           (out_00 + 0x38),(value_type *)&key_parser);
              }
              bVar1 = der::Parser::ReadOptionalTag
                                (&parser,0xa0000001,(Input *)(out_00 + 0x58),(bool *)(out_00 + 0x50)
                                );
              if (bVar1) {
                bVar1 = der::Parser::HasMore(&parser);
                return !bVar1;
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ParseOCSPResponseData(der::Input raw_tlv, OCSPResponseData *out) {
  der::Parser outer_parser(raw_tlv);
  der::Parser parser;
  if (!outer_parser.ReadSequence(&parser)) {
    return false;
  }
  if (outer_parser.HasMore()) {
    return false;
  }

  der::Input version_input;
  bool version_present;
  if (!parser.ReadOptionalTag(
          CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 0, &version_input,
          &version_present)) {
    return false;
  }

  // For compatibilty, we ignore the restriction from X.690 Section 11.5 that
  // DEFAULT values should be omitted for values equal to the default value.
  // TODO: Add warning about non-strict parsing.
  if (version_present) {
    der::Parser version_parser(version_input);
    if (!version_parser.ReadUint8(&(out->version))) {
      return false;
    }
    if (version_parser.HasMore()) {
      return false;
    }
  } else {
    out->version = 0;
  }

  if (out->version != 0) {
    return false;
  }

  der::Input responder_input;
  if (!parser.ReadRawTLV(&responder_input)) {
    return false;
  }
  if (!ParseResponderID(responder_input, &(out->responder_id))) {
    return false;
  }
  if (!parser.ReadGeneralizedTime(&(out->produced_at))) {
    return false;
  }

  der::Parser responses_parser;
  if (!parser.ReadSequence(&responses_parser)) {
    return false;
  }
  out->responses.clear();
  while (responses_parser.HasMore()) {
    der::Input single_response;
    if (!responses_parser.ReadRawTLV(&single_response)) {
      return false;
    }
    out->responses.push_back(single_response);
  }

  if (!parser.ReadOptionalTag(
          CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 1,
          &(out->extensions), &(out->has_extensions))) {
    return false;
  }

  return !parser.HasMore();
}